

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_segs.cpp
# Opt level: O2

void wallscan_striped(int x1,int x2,short *uwal,short *dwal,float *swal,fixed_t *lwal,double yrepeat
                     )

{
  short sVar1;
  lightlist_t *plVar2;
  FDynamicColormap *pFVar3;
  bool foggy;
  int iVar4;
  int j;
  int iVar5;
  long lVar6;
  short sVar7;
  ulong uVar8;
  short *dwal_00;
  short *psVar9;
  short most3 [5760];
  short most1 [5760];
  short most2 [5760];
  short local_8738 [5760];
  short local_5a38 [5760];
  short local_2d38 [5764];
  
  iVar4 = wallshade;
  foggy = ::foggy;
  pFVar3 = basecolormap;
  if (x1 < WallC.sx1) {
    __assert_fail("WallC.sx1 <= x1",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/r_segs.cpp"
                  ,0x4ea,
                  "void wallscan_striped(int, int, short *, short *, float *, fixed_t *, double)");
  }
  if (WallC.sx2 < x2) {
    __assert_fail("WallC.sx2 >= x2",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/r_segs.cpp"
                  ,0x4eb,
                  "void wallscan_striped(int, int, short *, short *, float *, fixed_t *, double)");
  }
  dwal_00 = local_5a38;
  for (uVar8 = 0; uVar8 < (frontsector->e->XFloor).lightlist.Count; uVar8 = uVar8 + 1) {
    iVar5 = WallMost(local_8738,&(frontsector->e->XFloor).lightlist.Array[uVar8].plane,&WallC);
    lVar6 = (long)x1;
    psVar9 = dwal_00;
    if (iVar5 != 3) {
      for (; lVar6 < x2; lVar6 = lVar6 + 1) {
        sVar1 = local_8738[lVar6];
        sVar7 = dwal[lVar6];
        if (sVar1 < dwal[lVar6]) {
          sVar7 = sVar1;
        }
        if (sVar1 <= uwal[lVar6]) {
          sVar7 = uwal[lVar6];
        }
        dwal_00[lVar6] = sVar7;
      }
      wallscan(x1,x2,uwal,dwal_00,swal,lwal,yrepeat,R_GetColumn);
      psVar9 = local_5a38;
      uwal = dwal_00;
      if (dwal_00 == local_5a38) {
        psVar9 = local_2d38;
      }
    }
    plVar2 = (frontsector->e->XFloor).lightlist.Array;
    basecolormap = plVar2[uVar8].extra_colormap;
    iVar5 = side_t::GetLightLevel
                      (curline->sidedef,foggy,(int)*plVar2[uVar8].p_lightlevel,
                       plVar2[uVar8].lightsource != (F3DFloor *)0x0,(int *)0x0);
    wallshade = (iVar5 + r_actualextralight) * -0x4000 + 0x3d0000;
    dwal_00 = psVar9;
  }
  wallscan(x1,x2,uwal,dwal,swal,lwal,yrepeat,R_GetColumn);
  basecolormap = pFVar3;
  wallshade = iVar4;
  return;
}

Assistant:

void wallscan_striped (int x1, int x2, short *uwal, short *dwal, float *swal, fixed_t *lwal, double yrepeat)
{
	FDynamicColormap *startcolormap = basecolormap;
	int startshade = wallshade;
	bool fogginess = foggy;

	short most1[MAXWIDTH], most2[MAXWIDTH], most3[MAXWIDTH];
	short *up, *down;

	up = uwal;
	down = most1;

	assert(WallC.sx1 <= x1);
	assert(WallC.sx2 >= x2);

	// kg3D - fake floors instead of zdoom light list
	for (unsigned int i = 0; i < frontsector->e->XFloor.lightlist.Size(); i++)
	{
		int j = WallMost (most3, frontsector->e->XFloor.lightlist[i].plane, &WallC);
		if (j != 3)
		{
			for (int j = x1; j < x2; ++j)
			{
				down[j] = clamp (most3[j], up[j], dwal[j]);
			}
			wallscan (x1, x2, up, down, swal, lwal, yrepeat);
			up = down;
			down = (down == most1) ? most2 : most1;
		}

		lightlist_t *lit = &frontsector->e->XFloor.lightlist[i];
		basecolormap = lit->extra_colormap;
		wallshade = LIGHT2SHADE(curline->sidedef->GetLightLevel(fogginess,
			*lit->p_lightlevel, lit->lightsource != NULL) + r_actualextralight);
 	}

	wallscan (x1, x2, up, dwal, swal, lwal, yrepeat);
	basecolormap = startcolormap;
	wallshade = startshade;
}